

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

void SetWindowState(uint flags)

{
  if ((~CORE.Window.flags & flags & 0x40) != 0) {
    glfwSwapInterval(1);
    CORE.Window.flags = CORE.Window.flags | 0x40;
  }
  if ((short)(~(ushort)CORE.Window.flags & (ushort)flags) < 0) {
    ToggleBorderlessWindowed();
  }
  if (((CORE.Window.flags ^ flags) & 2) != 0) {
    ToggleFullscreen();
  }
  if ((~CORE.Window.flags & flags & 4) != 0) {
    glfwSetWindowAttrib(platform.handle,0x20003,1);
    CORE.Window.flags = CORE.Window.flags | 4;
  }
  if ((~CORE.Window.flags & flags & 8) != 0) {
    glfwSetWindowAttrib(platform.handle,0x20005,0);
    CORE.Window.flags = CORE.Window.flags | 8;
  }
  if ((char)(~(byte)CORE.Window.flags & (byte)flags) < '\0') {
    glfwHideWindow(platform.handle);
    CORE.Window.flags = CORE.Window.flags | 0x80;
  }
  if (((~CORE.Window.flags & flags) >> 9 & 1) != 0) {
    glfwIconifyWindow(platform.handle);
  }
  if (((~CORE.Window.flags & flags) >> 10 & 1) != 0) {
    MaximizeWindow();
  }
  if (((~CORE.Window.flags & flags) >> 0xb & 1) != 0) {
    glfwSetWindowAttrib(platform.handle,0x2000c,0);
    CORE.Window.flags = CORE.Window.flags | 0x800;
  }
  if (((~CORE.Window.flags & flags) >> 0xc & 1) != 0) {
    glfwSetWindowAttrib(platform.handle,0x20007,1);
    CORE.Window.flags = CORE.Window.flags | 0x1000;
  }
  if (((~CORE.Window.flags & flags) >> 8 & 1) != 0) {
    CORE.Window.flags = CORE.Window.flags | 0x100;
  }
  if ((~CORE.Window.flags & flags & 0x10) != 0) {
    TraceLog(4,
             "WINDOW: Framebuffer transparency can only be configured before window initialization")
    ;
  }
  if (((~CORE.Window.flags & flags) >> 0xd & 1) != 0) {
    TraceLog(4,"WINDOW: High DPI can only be configured before window initialization");
  }
  if (((~CORE.Window.flags & flags) >> 0xe & 1) != 0) {
    glfwSetWindowAttrib(platform.handle,0x2000d,1);
    CORE.Window.flags = CORE.Window.flags | 0x4000;
  }
  if ((~CORE.Window.flags & flags & 0x20) != 0) {
    TraceLog(4,"WINDOW: MSAA can only be configured before window initialization");
  }
  if (((~CORE.Window.flags & flags) >> 0x10 & 1) != 0) {
    TraceLog(4,"RPI: Interlaced mode can only be configured before window initialization");
    return;
  }
  return;
}

Assistant:

void SetWindowState(unsigned int flags)
{
    // Check previous state and requested state to apply required changes
    // NOTE: In most cases the functions already change the flags internally

    // State change: FLAG_VSYNC_HINT
    if (((CORE.Window.flags & FLAG_VSYNC_HINT) != (flags & FLAG_VSYNC_HINT)) && ((flags & FLAG_VSYNC_HINT) > 0))
    {
        glfwSwapInterval(1);
        CORE.Window.flags |= FLAG_VSYNC_HINT;
    }

    // State change: FLAG_BORDERLESS_WINDOWED_MODE
    // NOTE: This must be handled before FLAG_FULLSCREEN_MODE because ToggleBorderlessWindowed() needs to get some fullscreen values if fullscreen is running
    if (((CORE.Window.flags & FLAG_BORDERLESS_WINDOWED_MODE) != (flags & FLAG_BORDERLESS_WINDOWED_MODE)) && ((flags & FLAG_BORDERLESS_WINDOWED_MODE) > 0))
    {
        ToggleBorderlessWindowed();     // NOTE: Window state flag updated inside function
    }

    // State change: FLAG_FULLSCREEN_MODE
    if ((CORE.Window.flags & FLAG_FULLSCREEN_MODE) != (flags & FLAG_FULLSCREEN_MODE))
    {
        ToggleFullscreen();     // NOTE: Window state flag updated inside function
    }

    // State change: FLAG_WINDOW_RESIZABLE
    if (((CORE.Window.flags & FLAG_WINDOW_RESIZABLE) != (flags & FLAG_WINDOW_RESIZABLE)) && ((flags & FLAG_WINDOW_RESIZABLE) > 0))
    {
        glfwSetWindowAttrib(platform.handle, GLFW_RESIZABLE, GLFW_TRUE);
        CORE.Window.flags |= FLAG_WINDOW_RESIZABLE;
    }

    // State change: FLAG_WINDOW_UNDECORATED
    if (((CORE.Window.flags & FLAG_WINDOW_UNDECORATED) != (flags & FLAG_WINDOW_UNDECORATED)) && (flags & FLAG_WINDOW_UNDECORATED))
    {
        glfwSetWindowAttrib(platform.handle, GLFW_DECORATED, GLFW_FALSE);
        CORE.Window.flags |= FLAG_WINDOW_UNDECORATED;
    }

    // State change: FLAG_WINDOW_HIDDEN
    if (((CORE.Window.flags & FLAG_WINDOW_HIDDEN) != (flags & FLAG_WINDOW_HIDDEN)) && ((flags & FLAG_WINDOW_HIDDEN) > 0))
    {
        glfwHideWindow(platform.handle);
        CORE.Window.flags |= FLAG_WINDOW_HIDDEN;
    }

    // State change: FLAG_WINDOW_MINIMIZED
    if (((CORE.Window.flags & FLAG_WINDOW_MINIMIZED) != (flags & FLAG_WINDOW_MINIMIZED)) && ((flags & FLAG_WINDOW_MINIMIZED) > 0))
    {
        //GLFW_ICONIFIED
        MinimizeWindow();       // NOTE: Window state flag updated inside function
    }

    // State change: FLAG_WINDOW_MAXIMIZED
    if (((CORE.Window.flags & FLAG_WINDOW_MAXIMIZED) != (flags & FLAG_WINDOW_MAXIMIZED)) && ((flags & FLAG_WINDOW_MAXIMIZED) > 0))
    {
        //GLFW_MAXIMIZED
        MaximizeWindow();       // NOTE: Window state flag updated inside function
    }

    // State change: FLAG_WINDOW_UNFOCUSED
    if (((CORE.Window.flags & FLAG_WINDOW_UNFOCUSED) != (flags & FLAG_WINDOW_UNFOCUSED)) && ((flags & FLAG_WINDOW_UNFOCUSED) > 0))
    {
        glfwSetWindowAttrib(platform.handle, GLFW_FOCUS_ON_SHOW, GLFW_FALSE);
        CORE.Window.flags |= FLAG_WINDOW_UNFOCUSED;
    }

    // State change: FLAG_WINDOW_TOPMOST
    if (((CORE.Window.flags & FLAG_WINDOW_TOPMOST) != (flags & FLAG_WINDOW_TOPMOST)) && ((flags & FLAG_WINDOW_TOPMOST) > 0))
    {
        glfwSetWindowAttrib(platform.handle, GLFW_FLOATING, GLFW_TRUE);
        CORE.Window.flags |= FLAG_WINDOW_TOPMOST;
    }

    // State change: FLAG_WINDOW_ALWAYS_RUN
    if (((CORE.Window.flags & FLAG_WINDOW_ALWAYS_RUN) != (flags & FLAG_WINDOW_ALWAYS_RUN)) && ((flags & FLAG_WINDOW_ALWAYS_RUN) > 0))
    {
        CORE.Window.flags |= FLAG_WINDOW_ALWAYS_RUN;
    }

    // The following states can not be changed after window creation

    // State change: FLAG_WINDOW_TRANSPARENT
    if (((CORE.Window.flags & FLAG_WINDOW_TRANSPARENT) != (flags & FLAG_WINDOW_TRANSPARENT)) && ((flags & FLAG_WINDOW_TRANSPARENT) > 0))
    {
        TRACELOG(LOG_WARNING, "WINDOW: Framebuffer transparency can only be configured before window initialization");
    }

    // State change: FLAG_WINDOW_HIGHDPI
    if (((CORE.Window.flags & FLAG_WINDOW_HIGHDPI) != (flags & FLAG_WINDOW_HIGHDPI)) && ((flags & FLAG_WINDOW_HIGHDPI) > 0))
    {
        TRACELOG(LOG_WARNING, "WINDOW: High DPI can only be configured before window initialization");
    }

    // State change: FLAG_WINDOW_MOUSE_PASSTHROUGH
    if (((CORE.Window.flags & FLAG_WINDOW_MOUSE_PASSTHROUGH) != (flags & FLAG_WINDOW_MOUSE_PASSTHROUGH)) && ((flags & FLAG_WINDOW_MOUSE_PASSTHROUGH) > 0))
    {
        glfwSetWindowAttrib(platform.handle, GLFW_MOUSE_PASSTHROUGH, GLFW_TRUE);
        CORE.Window.flags |= FLAG_WINDOW_MOUSE_PASSTHROUGH;
    }

    // State change: FLAG_MSAA_4X_HINT
    if (((CORE.Window.flags & FLAG_MSAA_4X_HINT) != (flags & FLAG_MSAA_4X_HINT)) && ((flags & FLAG_MSAA_4X_HINT) > 0))
    {
        TRACELOG(LOG_WARNING, "WINDOW: MSAA can only be configured before window initialization");
    }

    // State change: FLAG_INTERLACED_HINT
    if (((CORE.Window.flags & FLAG_INTERLACED_HINT) != (flags & FLAG_INTERLACED_HINT)) && ((flags & FLAG_INTERLACED_HINT) > 0))
    {
        TRACELOG(LOG_WARNING, "RPI: Interlaced mode can only be configured before window initialization");
    }
}